

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_float_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  float value;
  bool bVar1;
  CompilerError *this_00;
  char (*in_stack_fffffffffffffc90) [5];
  char *comment;
  spirv_cross local_358 [32];
  char print_buffer [32];
  string local_310;
  undefined1 local_2f0 [32];
  uint *local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  uint local_2b8 [8];
  bool *local_298;
  size_t local_290;
  size_t local_288;
  bool local_280 [8];
  uint32_t local_278;
  bool local_274;
  bool local_273;
  anon_struct_16_4_af6aef73_for_cooperative local_270;
  StorageClass local_260;
  TypedID<(spirv_cross::Types)1> *local_258;
  size_t local_250;
  size_t local_248;
  TypedID<(spirv_cross::Types)1> local_240 [8];
  uint *local_220;
  size_t local_218;
  size_t local_210;
  uint local_208 [8];
  undefined1 local_1e8 [28];
  TypeID local_1cc;
  __node_base_ptr *local_1c8;
  size_type local_1c0;
  __node_base local_1b8;
  size_type sStack_1b0;
  float local_1a8;
  size_t local_1a0;
  __node_base_ptr p_Stack_198;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint auStack_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  value = (c->m).c[col].r[row].f32;
  if (NAN(value) || ABS(value) == INFINITY) {
    bVar1 = is_legacy(this);
    if (bVar1) {
      if (((value < INFINITY) && (-INFINITY < value)) && (!NAN(value))) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot represent non-finite floating point constant.")
        ;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      local_2d0 = local_2b8;
      local_2f0._8_4_ = 0;
      local_2f0._0_8_ = &PTR__SPIRType_0047ef28;
      local_2f0._12_4_ = 0x16;
      local_2f0._28_4_ = 1;
      local_2c8 = 0;
      local_2c0 = 8;
      local_298 = local_280;
      local_290 = 0;
      local_288 = 8;
      local_278 = 0;
      local_274 = false;
      local_273 = false;
      local_270.use_id = 0;
      local_270.rows_id = 0;
      local_270.columns_id = 0;
      local_270.scope_id = 0;
      local_260 = Generic;
      local_258 = local_240;
      local_250 = 0;
      local_248 = 8;
      local_220 = local_208;
      local_218 = 0;
      local_210 = 8;
      local_1e8._0_7_ = 0;
      local_1e8._7_4_ = 0;
      local_1cc.id = 0;
      local_1c8 = &p_Stack_198;
      local_1e8._12_4_ = 0;
      local_1e8._16_4_ = ImageFormatUnknown;
      local_1e8._20_4_ = AccessQualifierReadOnly;
      local_1e8._24_4_ = 0;
      local_1c0 = 1;
      local_1b8._M_nxt = (_Hash_node_base *)0x0;
      sStack_1b0 = 0;
      local_1a8 = 1.0;
      local_190._32_8_ = local_190 + 0x38;
      local_190._8_8_ = 0x1500000000;
      local_190._0_8_ = &PTR__SPIRType_0047ef28;
      local_190._24_4_ = 1;
      local_190._40_8_ = 0;
      local_1a0 = 0;
      p_Stack_198 = (__node_base_ptr)0x0;
      local_190._48_8_ = 8;
      local_190._88_8_ = local_190 + 0x70;
      local_190._96_8_ = 0;
      local_190._104_8_ = 8;
      local_190._120_4_ = 0;
      local_190[0x7c] = false;
      local_190[0x7d] = false;
      local_190._128_4_ = 0;
      local_190._132_4_ = 0;
      local_190._136_4_ = 0;
      local_190._140_4_ = 0;
      local_190._144_4_ = Generic;
      local_190._160_8_ = 0;
      local_190._152_8_ = local_190 + 0xb0;
      local_190._168_8_ = 8;
      local_c0 = auStack_a8;
      local_b8 = 0;
      local_b0 = 8;
      local_88._0_7_ = 0;
      local_68 = &p_Stack_38;
      local_88._7_4_ = 0;
      local_88._12_4_ = 0;
      local_88._16_4_ = ImageFormatUnknown;
      local_88._20_4_ = AccessQualifierReadOnly;
      local_88._24_4_ = 0;
      local_6c.id = 0;
      local_60 = 1;
      local_58._M_nxt = (_Hash_node_base *)0x0;
      sStack_50 = 0;
      local_48 = 1.0;
      local_40 = 0;
      p_Stack_38 = (__node_base_ptr)0x0;
      local_2f0._16_4_ = 0xd;
      local_190._16_4_ = UInt;
      local_190._20_4_ = 0x20;
      local_2f0._20_8_ = 0x100000020;
      local_190._28_4_ = local_190._24_4_;
      snprintf(print_buffer,0x20,"0x%xu",(ulong)(c->m).c[col].r[row].u32);
      comment = "inf";
      if (-INFINITY < value) {
        if (NAN(value)) {
          comment = "nan";
        }
      }
      else {
        comment = "-inf";
      }
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_358,this,local_2f0,local_190);
      join<std::__cxx11::string,char_const(&)[2],char(&)[32],char_const(&)[5],char_const*&,char_const(&)[5]>
                (&local_310,local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3457d9,
                 (char (*) [2])print_buffer,(char (*) [32])" /* ",(char (*) [5])&comment,
                 (char **)" */)",in_stack_fffffffffffffc90);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_310);
      ::std::__cxx11::string::~string((string *)&local_310);
      ::std::__cxx11::string::~string((string *)local_358);
      SPIRType::~SPIRType((SPIRType *)local_190);
      SPIRType::~SPIRType((SPIRType *)local_2f0);
    }
  }
  else {
    format_float_abi_cxx11_((string *)local_2f0,this,value);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_2f0);
    ::std::__cxx11::string::~string((string *)local_2f0);
    if ((this->backend).float_literal_suffix == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_float_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f32(col, row);

	if (std::isnan(float_value) || std::isinf(float_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Float;
			in_type.basetype = SPIRType::UInt;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 32;
			in_type.width = 32;

			char print_buffer[32];
#ifdef _WIN32
			sprintf(print_buffer, "0x%xu", c.scalar(col, row));
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%xu", c.scalar(col, row));
#endif

			const char *comment = "inf";
			if (float_value == -numeric_limits<float>::infinity())
				comment = "-inf";
			else if (std::isnan(float_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (float_value == numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(1.0f / 0.0f)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (float_value == -numeric_limits<float>::infinity())
			{
				if (backend.float_literal_suffix)
					res = "(-1.0f / 0.0f)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(float_value))
			{
				if (backend.float_literal_suffix)
					res = "(0.0f / 0.0f)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_float(float_value);
		if (backend.float_literal_suffix)
			res += "f";
	}

	return res;
}